

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

QString * __thiscall
QFileDialog::selectedMimeTypeFilter(QString *__return_storage_ptr__,QFileDialog *this)

{
  QDialogPrivate *this_00;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  QPlatformDialogHelper *pQVar5;
  undefined1 *puVar6;
  QString *pQVar7;
  QArrayData *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QArrayDataPointer<QString> local_c8;
  QArrayDataPointer<QString> local_b0;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((this_00->nativeDialogInUse != false) ||
     (this_00[1].super_QWidgetPrivate.focus_child == (QWidget *)0x0)) {
    pQVar5 = QDialogPrivate::platformHelper(this_00);
    if (pQVar5 == (QPlatformDialogHelper *)0x0) {
      puVar6 = (undefined1 *)0x0;
      pQVar7 = (QString *)0x0;
      pQVar8 = (QArrayData *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar5 + 0xc0))(&local_58,pQVar5);
      puVar6 = (undefined1 *)local_58.size;
      pQVar7 = local_58.ptr;
      pQVar8 = &(local_58.d)->super_QArrayData;
    }
    (__return_storage_ptr__->d).d = (Data *)pQVar8;
    (__return_storage_ptr__->d).ptr = (char16_t *)pQVar7;
    (__return_storage_ptr__->d).size = (qsizetype)puVar6;
    if (pQVar7 != (QString *)0x0) goto LAB_004e48c3;
  }
  QFileDialogOptions::mimeTypeFilters();
  qVar3 = local_58.size;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if ((undefined1 *)qVar3 != (undefined1 *)0x0) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    selectedNameFilter((QString *)&local_58,this);
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QFileDialogOptions::mimeTypeFilters();
    if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
      lVar9 = local_78.size * 0x18;
      pQVar7 = local_78.ptr;
      do {
        local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        nameFilterForMime(&local_98,pQVar7);
        cVar4 = QFileDialogOptions::testOption
                          ((FileDialogOption)
                           *(undefined8 *)
                            (*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x3d0));
        qVar3 = local_98.d.size;
        pcVar2 = local_98.d.ptr;
        pDVar1 = local_98.d.d;
        if (cVar4 != '\0') {
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_b0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_c8.ptr = (QString *)
                         QArrayData::allocate((QArrayData **)&local_b0,0x18,0x10,1,KeepSize);
          local_c8.d = local_b0.d;
          ((local_c8.ptr)->d).d = pDVar1;
          ((local_c8.ptr)->d).ptr = pcVar2;
          ((local_c8.ptr)->d).size = qVar3;
          if (&pDVar1->super_QArrayData == (QArrayData *)0x0) {
            local_c8.size = 1;
            qt_strip_filters((QStringList *)&local_b0,(QStringList *)&local_c8);
            QString::operator=(&local_98,(QString *)local_b0.ptr);
            QArrayDataPointer<QString>::~QArrayDataPointer(&local_b0);
            QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
          }
          else {
            LOCK();
            (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
            local_c8.size = 1;
            qt_strip_filters((QStringList *)&local_b0,(QStringList *)&local_c8);
            QString::operator=(&local_98,(QString *)local_b0.ptr);
            QArrayDataPointer<QString>::~QArrayDataPointer(&local_b0);
            QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
            LOCK();
            (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
            }
          }
        }
        if ((local_98.d.size == local_58.size) &&
           (QVar10.m_data = local_98.d.ptr, QVar10.m_size = local_98.d.size,
           QVar11.m_data = (storage_type_conflict *)local_58.ptr, QVar11.m_size = local_98.d.size,
           cVar4 = QtPrivate::equalStrings(QVar10,QVar11), cVar4 != '\0')) {
          QString::operator=(__return_storage_ptr__,(QString *)pQVar7);
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            }
          }
          break;
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar7 = pQVar7 + 1;
        lVar9 = lVar9 + -0x18;
      } while (lVar9 != 0);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
      }
    }
  }
LAB_004e48c3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFileDialog::selectedMimeTypeFilter() const
{
    Q_D(const QFileDialog);
    QString mimeTypeFilter;
    if (!d->usingWidgets())
        mimeTypeFilter = d->selectedMimeTypeFilter_sys();

#if QT_CONFIG(mimetype)
    if (mimeTypeFilter.isNull() && !d->options->mimeTypeFilters().isEmpty()) {
        const auto nameFilter = selectedNameFilter();
        const auto mimeTypes = d->options->mimeTypeFilters();
        for (const auto &mimeType: mimeTypes) {
            QString filter = nameFilterForMime(mimeType);
            if (testOption(HideNameFilterDetails))
                filter = qt_strip_filters({ filter }).constFirst();
            if (filter == nameFilter) {
                mimeTypeFilter = mimeType;
                break;
            }
        }
    }
#endif

    return mimeTypeFilter;
}